

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::DestroyAll
          (SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode> *this)

{
  SmallVector<void_*,_4U> *this_00;
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  char *pcVar6;
  reference ppvVar7;
  byte bVar8;
  uint uVar9;
  char *End;
  pair<void_*,_unsigned_long> *PtrAndSize;
  undefined8 *puVar10;
  long lVar11;
  anon_class_1_0_00000001 local_31 [8];
  anon_class_1_0_00000001 DestroyElements;
  
  this_00 = &(this->Allocator).Slabs;
  pvVar2 = (this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
           super_SmallVectorTemplateBase<void_*,_true>.super_SmallVectorTemplateCommon<void_*,_void>
           .super_SmallVectorBase.BeginX;
  uVar1 = (this->Allocator).Slabs.super_SmallVectorImpl<void_*>.
          super_SmallVectorTemplateBase<void_*,_true>.super_SmallVectorTemplateCommon<void_*,_void>.
          super_SmallVectorBase.Size;
  for (lVar11 = 0; (ulong)uVar1 << 3 != lVar11; lVar11 = lVar11 + 8) {
    pvVar3 = (this_00->super_SmallVectorImpl<void_*>).super_SmallVectorTemplateBase<void_*,_true>.
             super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
    pcVar6 = (char *)alignAddr(*(void **)((long)pvVar2 + lVar11),(Align)0x3);
    pvVar4 = *(void **)((long)pvVar2 + lVar11);
    ppvVar7 = SmallVectorTemplateCommon<void_*,_void>::back
                        ((SmallVectorTemplateCommon<void_*,_void> *)this_00);
    if (pvVar4 == *ppvVar7) {
      End = (this->Allocator).CurPtr;
    }
    else {
      uVar9 = (uint)((ulong)((long)pvVar2 + (lVar11 - (long)pvVar3)) >> 10) & 0x1ffffff;
      bVar8 = (byte)uVar9;
      if (0x1d < uVar9) {
        bVar8 = 0x1e;
      }
      End = (char *)((0x1000L << (bVar8 & 0x3f)) + *(long *)((long)pvVar2 + lVar11));
    }
    DestroyAll::anon_class_1_0_00000001::operator()(local_31,pcVar6,End);
  }
  puVar10 = (undefined8 *)
            (this->Allocator).CustomSizedSlabs.
            super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
            super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
            super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
            super_SmallVectorBase.BeginX;
  for (lVar11 = (ulong)(this->Allocator).CustomSizedSlabs.
                       super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>.
                       super_SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>.
                       super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>.
                       super_SmallVectorBase.Size << 4; lVar11 != 0; lVar11 = lVar11 + -0x10) {
    pvVar2 = (void *)*puVar10;
    lVar5 = puVar10[1];
    pcVar6 = (char *)alignAddr(pvVar2,(Align)0x3);
    DestroyAll::anon_class_1_0_00000001::operator()(local_31,pcVar6,(char *)(lVar5 + (long)pvVar2));
    puVar10 = puVar10 + 2;
  }
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Reset(&this->Allocator);
  return;
}

Assistant:

void DestroyAll() {
    auto DestroyElements = [](char *Begin, char *End) {
      assert(Begin == (char *)alignAddr(Begin, Align::Of<T>()));
      for (char *Ptr = Begin; Ptr + sizeof(T) <= End; Ptr += sizeof(T))
        reinterpret_cast<T *>(Ptr)->~T();
    };

    for (auto I = Allocator.Slabs.begin(), E = Allocator.Slabs.end(); I != E;
         ++I) {
      size_t AllocatedSlabSize = BumpPtrAllocator::computeSlabSize(
          std::distance(Allocator.Slabs.begin(), I));
      char *Begin = (char *)alignAddr(*I, Align::Of<T>());
      char *End = *I == Allocator.Slabs.back() ? Allocator.CurPtr
                                               : (char *)*I + AllocatedSlabSize;

      DestroyElements(Begin, End);
    }

    for (auto &PtrAndSize : Allocator.CustomSizedSlabs) {
      void *Ptr = PtrAndSize.first;
      size_t Size = PtrAndSize.second;
      DestroyElements((char *)alignAddr(Ptr, Align::Of<T>()),
                      (char *)Ptr + Size);
    }

    Allocator.Reset();
  }